

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int on_ack_stream_data_blocked_frame
              (quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,quicly_sent_t *sent)

{
  quicly_stream_t *stream;
  
  stream = quicly_get_stream((quicly_conn_t *)&map[-0x28].num_packets,(sent->data).stream.stream_id)
  ;
  if ((stream != (quicly_stream_t *)0x0) &&
     ((stream->_send_aux).max_stream_data == (sent->data).packet.sent_at)) {
    if (acked == 0) {
      if (((packet->field_0x11 & 2) != 0) &&
         ((stream->_send_aux).blocked == QUICLY_SENDER_STATE_UNACKED)) {
        (stream->_send_aux).blocked = QUICLY_SENDER_STATE_SEND;
        sched_stream_control(stream);
      }
    }
    else {
      (stream->_send_aux).blocked = QUICLY_SENDER_STATE_ACKED;
    }
  }
  return 0;
}

Assistant:

static int on_ack_stream_data_blocked_frame(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked,
                                            quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));
    quicly_stream_t *stream;

    if ((stream = quicly_get_stream(conn, sent->data.stream_data_blocked.stream_id)) == NULL)
        return 0;

    if (stream->_send_aux.max_stream_data == sent->data.stream_data_blocked.offset) {
        if (acked) {
            stream->_send_aux.blocked = QUICLY_SENDER_STATE_ACKED;
        } else if (packet->frames_in_flight && stream->_send_aux.blocked == QUICLY_SENDER_STATE_UNACKED) {
            stream->_send_aux.blocked = QUICLY_SENDER_STATE_SEND;
            sched_stream_control(stream);
        }
    }

    return 0;
}